

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O1

void __thiscall Enemy::setup(Enemy *this,Spritesheet *spritesheet)

{
  pointer *ppSVar1;
  iterator iVar2;
  pointer pSVar3;
  float fVar4;
  float fVar5;
  
  iVar2._M_current =
       this->animations[0].frames.
       super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->startPos).field_0 = (this->super_AABB).center.field_0;
  pSVar3 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar2._M_current ==
      this->animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
    _M_realloc_insert<piksel::Sprite_const&>
              ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this->animations,iVar2,
               pSVar3 + 0x23);
  }
  else {
    fVar4 = pSVar3[0x23].sHeight;
    (iVar2._M_current)->sWidth = pSVar3[0x23].sWidth;
    (iVar2._M_current)->sHeight = fVar4;
    fVar4 = pSVar3[0x23].sx;
    fVar5 = pSVar3[0x23].sy;
    (iVar2._M_current)->img = pSVar3[0x23].img;
    (iVar2._M_current)->sx = fVar4;
    (iVar2._M_current)->sy = fVar5;
    ppSVar1 = &this->animations[0].frames.
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pSVar3 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2._M_current =
       this->animations[0].frames.
       super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      this->animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
    _M_realloc_insert<piksel::Sprite_const&>
              ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this->animations,iVar2,
               pSVar3 + 0x24);
  }
  else {
    fVar4 = pSVar3[0x24].sHeight;
    (iVar2._M_current)->sWidth = pSVar3[0x24].sWidth;
    (iVar2._M_current)->sHeight = fVar4;
    fVar4 = pSVar3[0x24].sx;
    fVar5 = pSVar3[0x24].sy;
    (iVar2._M_current)->img = pSVar3[0x24].img;
    (iVar2._M_current)->sx = fVar4;
    (iVar2._M_current)->sy = fVar5;
    ppSVar1 = &this->animations[0].frames.
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pSVar3 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2._M_current =
       this->animations[1].frames.
       super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current !=
      this->animations[1].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    fVar4 = pSVar3[0x25].sHeight;
    (iVar2._M_current)->sWidth = pSVar3[0x25].sWidth;
    (iVar2._M_current)->sHeight = fVar4;
    fVar4 = pSVar3[0x25].sx;
    fVar5 = pSVar3[0x25].sy;
    (iVar2._M_current)->img = pSVar3[0x25].img;
    (iVar2._M_current)->sx = fVar4;
    (iVar2._M_current)->sy = fVar5;
    ppSVar1 = &this->animations[1].frames.
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
    return;
  }
  std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
  _M_realloc_insert<piksel::Sprite_const&>
            ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)(this->animations + 1),iVar2,
             pSVar3 + 0x25);
  return;
}

Assistant:

void Enemy::setup(piksel::Spritesheet& spritesheet) {
    startPos = center;

    animations[WALKING].frames.push_back(spritesheet.sprites[35]);
    animations[WALKING].frames.push_back(spritesheet.sprites[36]);

    animations[DEAD].frames.push_back(spritesheet.sprites[37]);
}